

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void * __thiscall pbrt::Image::RawPointer(Image *this,Point2i p)

{
  PixelFormat PVar1;
  int iVar2;
  int iVar3;
  
  PVar1 = this->format;
  iVar3 = p.super_Tuple2<pbrt::Point2,_int>.x;
  iVar2 = p.super_Tuple2<pbrt::Point2,_int>.y;
  if (PVar1 == Float) {
    return (this->p32).ptr +
           (iVar2 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar3) *
           (int)(this->channelNames).nStored;
  }
  if (PVar1 != Half) {
    if (PVar1 == U256) {
      return (this->p8).ptr +
             (iVar2 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar3) *
             (int)(this->channelNames).nStored;
    }
    LogFatal<char_const(&)[16]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h"
               ,0x17f,"Check failed: %s",(char (*) [16])0x46661a);
  }
  return (this->p16).ptr +
         (iVar2 * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + iVar3) *
         (int)(this->channelNames).nStored;
}

Assistant:

PBRT_CPU_GPU
    const void *RawPointer(Point2i p) const {
        if (Is8Bit(format))
            return p8.data() + PixelOffset(p);
        if (Is16Bit(format))
            return p16.data() + PixelOffset(p);
        else {
            CHECK(Is32Bit(format));
            return p32.data() + PixelOffset(p);
        }
    }